

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Bool prvTidyFindNodeWithId(Node *node,TidyTagId tid)

{
  Bool BVar1;
  Node *content;
  Node *pNStack_18;
  TidyTagId tid_local;
  Node *node_local;
  
  pNStack_18 = node;
  while( true ) {
    if (pNStack_18 == (Node *)0x0) {
      return no;
    }
    if (((pNStack_18 != (Node *)0x0) && (pNStack_18->tag != (Dict *)0x0)) &&
       (pNStack_18->tag->id == tid)) break;
    if ((pNStack_18->content != (Node *)0x0) &&
       (BVar1 = prvTidyFindNodeWithId(pNStack_18->content,tid), BVar1 != no)) {
      return yes;
    }
    pNStack_18 = pNStack_18->next;
  }
  return yes;
}

Assistant:

Bool TY_(FindNodeWithId)( Node *node, TidyTagId tid )
{
    Node *content;
    while (node)
    {
        if (TagIsId(node,tid))
            return yes;
        /*\ 
         *   Issue #459 - Under certain circumstances, with many node this use of
         *   'for (content = node->content; content; content = content->content)'
         *   would produce a **forever** circle, or at least a very extended loop...
         *   It is sufficient to test the content, if it exists,
         *   to quickly iterate all nodes. Now all nodes are tested only once.
        \*/ 
        content = node->content;
        if (content)
        {
            if (TY_(FindNodeWithId)(content,tid))
                return yes;
        }
        node = node->next;
    }
    return no;
}